

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void av1_write_intra_coeffs_mb(AV1_COMMON *cm,MACROBLOCK *x,aom_writer *w,BLOCK_SIZE bsize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MACROBLOCKD *pMVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  BLOCK_SIZE in_CL;
  long lVar11;
  long in_RSI;
  AV1_COMMON *in_RDI;
  int blk_col;
  int blk_row;
  int unit_width;
  int unit_height;
  macroblockd_plane *pd;
  int step;
  int stepc;
  int stepr;
  TX_SIZE tx_size;
  int plane;
  int mu_blocks_high;
  int mu_blocks_wide;
  BLOCK_SIZE max_unit_bsize;
  int max_blocks_high;
  int max_blocks_wide;
  int col;
  int row;
  int block [3];
  int num_planes;
  MACROBLOCKD *xd;
  int in_stack_000015b4;
  int in_stack_000015b8;
  int in_stack_000015bc;
  aom_writer *in_stack_000015c0;
  MACROBLOCK *in_stack_000015c8;
  AV1_COMMON *in_stack_000015d0;
  int in_stack_00001610;
  TX_SIZE in_stack_00001618;
  MACROBLOCKD *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_58;
  int local_40;
  int local_3c;
  int local_38 [4];
  MACROBLOCKD *local_28;
  BLOCK_SIZE local_19;
  
  local_28 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_19 = in_CL;
  local_38[3] = av1_num_planes(in_RDI);
  memset(local_38,0,0xc);
  iVar8 = max_block_wide(local_28,local_19,0);
  iVar9 = max_block_high(local_28,local_19,0);
  local_84 = iVar8;
  if (0xf < iVar8) {
    local_84 = 0x10;
  }
  local_88 = iVar9;
  if (0xf < iVar9) {
    local_88 = 0x10;
  }
  for (local_3c = 0; local_3c < iVar9; local_3c = local_88 + local_3c) {
    for (local_40 = 0; local_40 < iVar8; local_40 = local_84 + local_40) {
      local_58 = 0;
      while ((local_58 < local_38[3] && ((local_58 == 0 || ((local_28->is_chroma_ref & 1U) != 0)))))
      {
        bVar7 = av1_get_tx_size(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        pMVar6 = local_28;
        iVar1 = tx_size_high_unit[bVar7];
        iVar2 = tx_size_wide_unit[bVar7];
        lVar11 = (long)local_58;
        local_8c = iVar9;
        if (local_88 + local_3c < iVar9) {
          local_8c = local_88 + local_3c;
        }
        iVar3 = local_28->plane[lVar11].subsampling_y;
        iVar4 = local_28->plane[lVar11].subsampling_y;
        in_stack_ffffffffffffff70 = iVar8;
        if (local_84 + local_40 < iVar8) {
          in_stack_ffffffffffffff70 = local_84 + local_40;
        }
        iVar10 = in_stack_ffffffffffffff70 +
                 ((1 << ((byte)local_28->plane[lVar11].subsampling_x & 0x1f)) >> 1);
        iVar5 = local_28->plane[lVar11].subsampling_x;
        for (local_7c = local_3c >> ((byte)local_28->plane[lVar11].subsampling_y & 0x1f);
            local_7c < local_8c + ((1 << ((byte)iVar3 & 0x1f)) >> 1) >> ((byte)iVar4 & 0x1f);
            local_7c = iVar1 + local_7c) {
          for (local_80 = local_40 >> ((byte)pMVar6->plane[lVar11].subsampling_x & 0x1f);
              local_80 < iVar10 >> ((byte)iVar5 & 0x1f); local_80 = iVar2 + local_80) {
            av1_write_coeffs_txb
                      (in_stack_000015d0,in_stack_000015c8,in_stack_000015c0,in_stack_000015bc,
                       in_stack_000015b8,in_stack_000015b4,in_stack_00001610,in_stack_00001618);
            local_38[local_58] = iVar1 * iVar2 + local_38[local_58];
          }
        }
        local_58 = local_58 + 1;
      }
    }
  }
  return;
}

Assistant:

void av1_write_intra_coeffs_mb(const AV1_COMMON *const cm, MACROBLOCK *x,
                               aom_writer *w, BLOCK_SIZE bsize) {
  MACROBLOCKD *xd = &x->e_mbd;
  const int num_planes = av1_num_planes(cm);
  int block[MAX_MB_PLANE] = { 0 };
  int row, col;
  assert(bsize == get_plane_block_size(bsize, xd->plane[0].subsampling_x,
                                       xd->plane[0].subsampling_y));
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const BLOCK_SIZE max_unit_bsize = BLOCK_64X64;
  int mu_blocks_wide = mi_size_wide[max_unit_bsize];
  int mu_blocks_high = mi_size_high[max_unit_bsize];
  mu_blocks_wide = AOMMIN(max_blocks_wide, mu_blocks_wide);
  mu_blocks_high = AOMMIN(max_blocks_high, mu_blocks_high);

  for (row = 0; row < max_blocks_high; row += mu_blocks_high) {
    for (col = 0; col < max_blocks_wide; col += mu_blocks_wide) {
      for (int plane = 0; plane < num_planes; ++plane) {
        if (plane && !xd->is_chroma_ref) break;
        const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
        const int stepr = tx_size_high_unit[tx_size];
        const int stepc = tx_size_wide_unit[tx_size];
        const int step = stepr * stepc;
        const struct macroblockd_plane *const pd = &xd->plane[plane];
        const int unit_height = ROUND_POWER_OF_TWO(
            AOMMIN(mu_blocks_high + row, max_blocks_high), pd->subsampling_y);
        const int unit_width = ROUND_POWER_OF_TWO(
            AOMMIN(mu_blocks_wide + col, max_blocks_wide), pd->subsampling_x);
        for (int blk_row = row >> pd->subsampling_y; blk_row < unit_height;
             blk_row += stepr) {
          for (int blk_col = col >> pd->subsampling_x; blk_col < unit_width;
               blk_col += stepc) {
            av1_write_coeffs_txb(cm, x, w, blk_row, blk_col, plane,
                                 block[plane], tx_size);
            block[plane] += step;
          }
        }
      }
    }
  }
}